

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

void sexp_add_path(sexp ctx,char *str)

{
  code *pcVar1;
  char *pcVar2;
  size_t sVar3;
  sexp psVar4;
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    pcVar2 = strchr(str,0x3a);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(str);
      pcVar2 = str + sVar3;
    }
    else {
      sexp_add_path(ctx,pcVar2 + 1);
    }
    sexp_push_op(ctx,(sexp_conflict *)&(((ctx->value).type.setters)->value).context.heap,
                 (sexp)&DAT_0000043e);
    psVar4 = sexp_c_string(ctx,str,(long)pcVar2 - (long)str);
    ((((ctx->value).type.setters)->value).context.heap)->max_size = (sexp_uint_t)psVar4;
    pcVar1 = (((ctx->value).type.setters)->value).type.finalize + 5;
    *pcVar1 = (code)((byte)*pcVar1 | 1);
  }
  return;
}

Assistant:

static void sexp_add_path (sexp ctx, const char *str) {
  const char *colon;
  if (str && *str) {
    colon = strchr(str, ':');
    if (colon)
      sexp_add_path(ctx, colon+1);
    else
      colon = str + strlen(str);
    sexp_push(ctx, sexp_global(ctx, SEXP_G_MODULE_PATH), SEXP_VOID);
    sexp_car(sexp_global(ctx, SEXP_G_MODULE_PATH))
      = sexp_c_string(ctx, str, colon-str);
    sexp_immutablep(sexp_global(ctx, SEXP_G_MODULE_PATH)) = 1;
  }
}